

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Mat6x6d * __thiscall
OpenMD::HydroProp::getResistanceTensorAtPos
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,Vector3d *pos)

{
  Mat3x3d U;
  RectMatrix<double,_3U,_3U> local_498;
  RectMatrix<double,_3U,_3U> local_450;
  Mat3x3d Xitr;
  RectMatrix<double,_3U,_3U> local_3c0;
  Mat3x3d Xipostr;
  Mat3x3d Xiposrr;
  Vector<double,_3U> local_2e8;
  Vector3d cp;
  SquareMatrix3<double> local_2b8;
  RectMatrix<double,_3U,_3U> local_270;
  RectMatrix<double,_3U,_3U> local_228;
  SquareMatrix3<double> local_1e0;
  RectMatrix<double,_3U,_3U> local_198;
  RectMatrix<double,_3U,_3U> local_150;
  Mat3x3d Xipostt;
  Mat3x3d Xirr;
  Mat3x3d Xitt;
  
  operator-((Vector<double,_3U> *)&U,&pos->super_Vector<double,_3U>,
            &(this->cor_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&cp.super_Vector<double,_3U>,(Vector<double,_3U> *)&U);
  SquareMatrix<double,_3>::SquareMatrix(&U.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&local_2e8,&cp.super_Vector<double,_3U>);
  SquareMatrix3<double>::setupSkewMat
            ((SquareMatrix3<double> *)&U.super_SquareMatrix<double,_3>,(Vector3<double> *)&local_2e8
            );
  getXitt(&Xitt,this);
  getXitr(&Xitr,this);
  getXirr(&Xirr,this);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&Xipostt);
  SquareMatrix<double,_3>::SquareMatrix(&Xiposrr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xipostr.super_SquareMatrix<double,_3>);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&Xipostt,(RectMatrix<double,_3U,_3U> *)&Xitt);
  operator*((SquareMatrix3<double> *)&local_498,
            (SquareMatrix3<double> *)&U.super_SquareMatrix<double,_3>,(SquareMatrix3<double> *)&Xitt
           );
  operator-(&local_450,(RectMatrix<double,_3U,_3U> *)&Xitr,&local_498);
  RectMatrix<double,_3U,_3U>::operator=(&local_3c0,&local_450);
  SquareMatrix3<double>::operator=(&Xipostr,(SquareMatrix<double,_3> *)&local_3c0);
  operator*(&local_1e0,&U,&Xitt);
  operator*((SquareMatrix3<double> *)&local_198,&local_1e0,&U);
  operator-(&local_150,(RectMatrix<double,_3U,_3U> *)&Xirr,&local_198);
  operator*((SquareMatrix3<double> *)&local_228,&Xitr,&U);
  operator+(&local_498,&local_150,&local_228);
  SquareMatrix3<double>::transpose(&local_2b8,&Xitr);
  operator*((SquareMatrix3<double> *)&local_270,&U,&local_2b8);
  operator-(&local_450,&local_498,&local_270);
  RectMatrix<double,_3U,_3U>::operator=(&local_3c0,&local_450);
  SquareMatrix3<double>::operator=(&Xiposrr,(SquareMatrix<double,_3> *)&local_3c0);
  SquareMatrix<double,_6>::SquareMatrix(__return_storage_ptr__);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,0,0,&Xipostt);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_3c0,&Xipostr);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,0,3,
             (SquareMatrix3<double> *)&local_3c0);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,3,0,&Xipostr);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,3,3,&Xiposrr);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getResistanceTensorAtPos(Vector3d pos) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_
    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat3x3d Xitt = getXitt();
    Mat3x3d Xitr = getXitr();
    Mat3x3d Xirr = getXirr();

    Mat3x3d Xipostt;
    Mat3x3d Xiposrr;
    Mat3x3d Xipostr;

    // Resistance tensors at the new location
    Xipostt = Xitt;
    Xipostr = (Xitr - U * Xitt);
    Xiposrr = Xirr - U * Xitt * U + Xitr * U - U * Xitr.transpose();

    Mat6x6d Xipos;
    Xipos.setSubMatrix(0, 0, Xipostt);
    Xipos.setSubMatrix(0, 3, Xipostr.transpose());
    Xipos.setSubMatrix(3, 0, Xipostr);
    Xipos.setSubMatrix(3, 3, Xiposrr);
    return Xipos;
  }